

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleSphere.h
# Opt level: O2

void __thiscall
pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>::X<double>
          (TPZTriangleSphere<pzgeom::TPZGeoTriangle> *this,TPZFMatrix<double> *cornerco,
          TPZVec<double> *loc,TPZVec<double> *result)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double local_110;
  TPZManVector<double,_3> Xc;
  TPZManVector<double,_3> XtminusXc;
  TPZManVector<double,_3> xqsi;
  TPZManVector<double,_3> Xsphere;
  
  XtminusXc.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&xqsi,3,(double *)&XtminusXc);
  Xc.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&XtminusXc,3,(double *)&Xc);
  TPZGeoTriangle::X<double>(cornerco,loc,&xqsi.super_TPZVec<double>);
  TPZManVector<double,_3>::TPZManVector(&Xc,&this->fXc);
  dVar3 = 0.0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    dVar4 = xqsi.super_TPZVec<double>.fStore[lVar2] - Xc.super_TPZVec<double>.fStore[lVar2];
    XtminusXc.super_TPZVec<double>.fStore[lVar2] = dVar4;
    dVar3 = dVar3 + dVar4 * dVar4;
  }
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  local_110 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&Xsphere,3,&local_110);
  pdVar1 = result->fStore;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    pdVar1[lVar2] =
         (this->fR / dVar3) * XtminusXc.super_TPZVec<double>.fStore[lVar2] +
         Xc.super_TPZVec<double>.fStore[lVar2];
  }
  TPZManVector<double,_3>::~TPZManVector(&Xsphere);
  TPZManVector<double,_3>::~TPZManVector(&Xc);
  TPZManVector<double,_3>::~TPZManVector(&XtminusXc);
  TPZManVector<double,_3>::~TPZManVector(&xqsi);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &cornerco,TPZVec<T> &loc,TPZVec<T> &result) const
        {
//            TPZFNMatrix<3*NNodes> coord(3,NNodes);
//            CornerCoordinates(gel, coord);
//            X(coord,loc,result);
            
            
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> XtminusXc(3,0.0); // will store (x,y,z)-xc
            GeomTriang::X(cornerco,loc,xqsi);
            TPZManVector<REAL,3> Xc = fXc;
            
            T NormValue = 0.0;
            
            for (int i = 0; i < 3; i++) {
                XtminusXc[i] = xqsi[i] - Xc[i];
                NormValue += XtminusXc[i]*XtminusXc[i];
            }
            
//            XtminusXc[0,0)= xqsi[0] - Xc[0];
//            XtminusXc(1,0)= xqsi[1] - Xc[1];
//            XtminusXc(2,0)= xqsi[2] - Xc[2];
            
            NormValue = sqrt(NormValue);
            
            TPZManVector<T,3> Xsphere(3,0.0);
            for(int i=0; i<3; i++)
            {
                result[i] = (fR/NormValue)*(XtminusXc[i])+ Xc[i];
            }
//            Xsphere[0] = (fR/NormValue)*(XtminusXc(0,0)+Xc[0]);
//            Xsphere[1] = (fR/NormValue)*(XtminusXc(1,0)+Xc[1]);
//            Xsphere[2] = (fR/NormValue)*(XtminusXc(2,0)+Xc[2]);		
//            result=Xsphere;
            
            
        }